

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read.c
# Opt level: O0

int archive_read_add_callback_data(archive *_a,void *client_data,uint iindex)

{
  int iVar1;
  uint uVar2;
  void *pvVar3;
  uint in_EDX;
  undefined8 in_RSI;
  archive *in_RDI;
  int magic_test;
  uint i;
  void *p;
  archive_read *a;
  char *in_stack_00000058;
  uint in_stack_00000060;
  uint in_stack_00000064;
  archive *in_stack_00000068;
  uint local_34;
  int local_4;
  
  iVar1 = __archive_check_magic
                    (in_stack_00000068,in_stack_00000064,in_stack_00000060,in_stack_00000058);
  if (iVar1 == -0x1e) {
    local_4 = -0x1e;
  }
  else if ((uint)in_RDI[2].archive_format < in_EDX) {
    archive_set_error(in_RDI,0x16,"Invalid index specified.");
    local_4 = -0x1e;
  }
  else {
    uVar2 = in_RDI[2].archive_format + 1;
    in_RDI[2].archive_format = uVar2;
    pvVar3 = realloc(*(void **)&in_RDI[2].compression_code,(ulong)uVar2 * 0x18);
    if (pvVar3 == (void *)0x0) {
      archive_set_error(in_RDI,0xc,"No memory.");
      local_4 = -0x1e;
    }
    else {
      *(void **)&in_RDI[2].compression_code = pvVar3;
      uVar2 = in_RDI[2].archive_format;
      while (local_34 = uVar2 - 1, in_EDX < local_34 && local_34 != 0) {
        *(undefined8 *)(*(long *)&in_RDI[2].compression_code + (ulong)local_34 * 0x18 + 0x10) =
             *(undefined8 *)
              (*(long *)&in_RDI[2].compression_code + (ulong)(uVar2 - 2) * 0x18 + 0x10);
        *(undefined8 *)(*(long *)&in_RDI[2].compression_code + (ulong)local_34 * 0x18) =
             0xffffffffffffffff;
        *(undefined8 *)(*(long *)&in_RDI[2].compression_code + (ulong)local_34 * 0x18 + 8) =
             0xffffffffffffffff;
        uVar2 = local_34;
      }
      *(undefined8 *)(*(long *)&in_RDI[2].compression_code + (ulong)in_EDX * 0x18 + 0x10) = in_RSI;
      *(undefined8 *)(*(long *)&in_RDI[2].compression_code + (ulong)in_EDX * 0x18) =
           0xffffffffffffffff;
      *(undefined8 *)(*(long *)&in_RDI[2].compression_code + (ulong)in_EDX * 0x18 + 8) =
           0xffffffffffffffff;
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

int
archive_read_add_callback_data(struct archive *_a, void *client_data,
    unsigned int iindex)
{
	struct archive_read *a = (struct archive_read *)_a;
	void *p;
	unsigned int i;

	archive_check_magic(_a, ARCHIVE_READ_MAGIC, ARCHIVE_STATE_NEW,
	    "archive_read_add_callback_data");
	if (iindex > a->client.nodes) {
		archive_set_error(&a->archive, EINVAL,
			"Invalid index specified.");
		return ARCHIVE_FATAL;
	}
	p = realloc(a->client.dataset, sizeof(*a->client.dataset)
		* (++(a->client.nodes)));
	if (p == NULL) {
		archive_set_error(&a->archive, ENOMEM,
			"No memory.");
		return ARCHIVE_FATAL;
	}
	a->client.dataset = (struct archive_read_data_node *)p;
	for (i = a->client.nodes - 1; i > iindex && i > 0; i--) {
		a->client.dataset[i].data = a->client.dataset[i-1].data;
		a->client.dataset[i].begin_position = -1;
		a->client.dataset[i].total_size = -1;
	}
	a->client.dataset[iindex].data = client_data;
	a->client.dataset[iindex].begin_position = -1;
	a->client.dataset[iindex].total_size = -1;
	return ARCHIVE_OK;
}